

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

bool __thiscall
bloaty::RangeSink::IsVerboseForVMRange(RangeSink *this,uint64_t vmaddr,uint64_t vmsize)

{
  _Rb_tree_header *p_Var1;
  uint64_t fileoff;
  bool bVar2;
  uint64_t uVar3;
  const_iterator iter;
  bool bVar4;
  Arg *in_R9;
  string_view format;
  allocator<char> local_b1;
  string local_b0;
  RangeMap file_map;
  RangeMap vm_map;
  
  if (vmsize == 0xffffffffffffffff) {
    vmsize = ~vmaddr;
  }
  if (vmsize <= ~vmaddr) {
    bVar2 = ContainsVerboseVMAddr(this,vmaddr,vmsize);
    bVar4 = true;
    if (!bVar2) {
      if ((this->translator_ == (DualMap *)0x0) ||
         (((this->options_)._has_bits_.has_bits_[0] & 0x80) == 0)) {
        bVar4 = false;
      }
      else {
        vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header;
        vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var1 = &file_map.mappings_._M_t._M_impl.super__Rb_tree_header;
        file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
        ;
        file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var1->_M_header;
        vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,anon_var_dwarf_37602c + 0x11,&local_b1);
        RangeMap::AddRangeWithTranslation
                  (&vm_map,vmaddr,vmsize,&local_b0,&this->translator_->vm_map,false,&file_map);
        std::__cxx11::string::~string((string *)&local_b0);
        bVar4 = false;
        for (iter._M_node = file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)iter._M_node != p_Var1;
            iter._M_node = (_Base_ptr)std::_Rb_tree_increment(iter._M_node)) {
          fileoff = *(uint64_t *)(iter._M_node + 1);
          uVar3 = RangeMap::RangeEnd(&file_map,iter);
          bVar2 = ContainsVerboseFileOffset(this,fileoff,uVar3 - *(long *)(iter._M_node + 1));
          bVar4 = (bool)(bVar4 | bVar2);
        }
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
                     *)&file_map);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
                     *)&vm_map);
      }
    }
    return bVar4;
  }
  absl::substitute_internal::Arg::Arg((Arg *)&vm_map,vmaddr);
  absl::substitute_internal::Arg::Arg((Arg *)&file_map,vmsize);
  format._M_str = (char *)&vm_map;
  format._M_len = (size_t)"Overflow in vm range, vmaddr=$0, vmsize=$1";
  absl::Substitute_abi_cxx11_(&local_b0,(absl *)0x2a,format,(Arg *)&file_map,in_R9);
  Throw(local_b0._M_dataplus._M_p,0x459);
}

Assistant:

bool RangeSink::IsVerboseForVMRange(uint64_t vmaddr, uint64_t vmsize) {
  if (vmsize == RangeMap::kUnknownSize) {
    vmsize = UINT64_MAX - vmaddr;
  }

  if (vmaddr + vmsize < vmaddr) {
    THROWF("Overflow in vm range, vmaddr=$0, vmsize=$1", vmaddr, vmsize);
  }

  if (ContainsVerboseVMAddr(vmaddr, vmsize)) {
    return true;
  }

  if (translator_ && options_.has_debug_fileoff()) {
    RangeMap vm_map;
    RangeMap file_map;
    bool contains = false;
    vm_map.AddRangeWithTranslation(vmaddr, vmsize, "", translator_->vm_map,
                                   false, &file_map);
    file_map.ForEachRange(
        [this, &contains](uint64_t fileoff, uint64_t filesize) {
          if (ContainsVerboseFileOffset(fileoff, filesize)) {
            contains = true;
          }
        });
    return contains;
  }

  return false;
}